

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retire_cid.c
# Opt level: O1

void quicly_retire_cid_push(quicly_retire_cid_set_t *set,uint64_t sequence)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar2 = set->_num_pending;
  if (uVar2 != 8) {
    bVar5 = uVar2 != 0;
    if (bVar5) {
      if (set->sequences[0] != sequence) {
        uVar4 = 0;
        do {
          if (uVar2 - 1 == uVar4) goto LAB_001292f3;
          uVar1 = uVar4 + 1;
          lVar3 = uVar4 + 1;
          uVar4 = uVar1;
        } while (set->sequences[lVar3] != sequence);
        bVar5 = uVar1 < uVar2;
      }
      if (bVar5) {
        return;
      }
    }
LAB_001292f3:
    set->sequences[uVar2] = sequence;
    set->_num_pending = set->_num_pending + 1;
  }
  return;
}

Assistant:

void quicly_retire_cid_push(quicly_retire_cid_set_t *set, uint64_t sequence)
{
    if (set->_num_pending == PTLS_ELEMENTSOF(set->sequences)) {
        /* in case we don't find an empty slot, we'll just drop this sequence (never send RETIRE_CONNECTION_ID frame) */
        return;
    }

    for (size_t i = 0; i < set->_num_pending; i++) {
        if (set->sequences[i] == sequence) {
            /* already scheduled */
            return;
        }
    }

    set->sequences[set->_num_pending] = sequence;
    set->_num_pending++;
}